

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSenseInput(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nConfLim;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *p;
  char *pcVar3;
  uint fVerbose;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fVerbose = 1;
  nConfLim = 1000;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Cvh"), iVar2 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        iVar2 = Abc_NtkGetChoiceNum(pNtk);
        if (iVar2 == 0) {
          if (pNtk->nObjCounts[8] == 0) {
            if (pNtk->ntkType == ABC_NTK_STRASH) {
              if (1 < pNtk->vPos->nSize) {
                p = Abc_NtkSensitivity(pNtk,nConfLim,fVerbose);
                Vec_IntFree(p);
                return 0;
              }
              pcVar3 = "The network should have at least two outputs.\n";
            }
            else {
              pcVar3 = "This command works only for strashed networks.\n";
            }
          }
          else {
            pcVar3 = "This command works only for combinational transition relations.\n";
          }
        }
        else {
          pcVar3 = "This command cannot be applied to an AIG with choice nodes.\n";
        }
      }
      iVar2 = -1;
      goto LAB_0025e512;
    }
    if (iVar1 != 0x43) goto LAB_0025e491;
    if (argc <= globalUtilOptind) break;
    nConfLim = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nConfLim < 0) {
LAB_0025e491:
      Abc_Print(-2,"usage: senseinput [-C num] [-vh]\n");
      Abc_Print(-2,"\t         computes sensitivity of POs to PIs under constraint\n");
      Abc_Print(-2,"\t         constraint should be represented as the last PO\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)nConfLim);
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar2 = -2;
LAB_0025e512:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_0025e491;
}

Assistant:

int Abc_CommandSenseInput( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Vec_Int_t * vResult;
    int c, nConfLim, fVerbose;

    extern Vec_Int_t * Abc_NtkSensitivity( Abc_Ntk_t * pNtk, int nConfLim, int fVerbose );
    // set defaults
    nConfLim   = 1000;
    fVerbose   =    1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLim < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum( pNtk ) )
    {
        Abc_Print( -1, "This command cannot be applied to an AIG with choice nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational transition relations.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    if ( Abc_NtkPoNum(pNtk) < 2 )
    {
        Abc_Print( -1, "The network should have at least two outputs.\n" );
        return 1;
    }

    vResult = Abc_NtkSensitivity( pNtk, nConfLim, fVerbose );
    Vec_IntFree( vResult );
    return 0;

usage:
    Abc_Print( -2, "usage: senseinput [-C num] [-vh]\n" );
    Abc_Print( -2, "\t         computes sensitivity of POs to PIs under constraint\n" );
    Abc_Print( -2, "\t         constraint should be represented as the last PO\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nConfLim );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}